

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O2

int __thiscall icu_63::RuleBasedNumberFormat::init(RuleBasedNumberFormat *this,EVP_PKEY_CTX *ctx)

{
  char *pcVar1;
  UBool UVar2;
  char16_t cVar3;
  int in_EAX;
  int i;
  undefined4 uVar4;
  uint uVar5;
  int32_t iVar6;
  int32_t iVar7;
  int iVar8;
  int extraout_EAX;
  NFRule *pNVar9;
  UnicodeString *pUVar10;
  NFRuleSet **ppNVar11;
  long lVar12;
  long *plVar13;
  NFRuleSet *pNVar14;
  undefined4 extraout_var;
  undefined8 *in_RCX;
  LocalizationInfo *in_RDX;
  int iVar15;
  ulong uVar16;
  size_t size;
  UChar *size_00;
  RuleBasedNumberFormat *this_00;
  UMemory *this_01;
  UErrorCode *in_R8;
  int i_1;
  ulong uVar17;
  uint offset;
  long lVar18;
  UErrorCode local_dc;
  ConstChar16Ptr local_d0;
  UnicodeString description;
  UnicodeString name;
  
  in_RCX[6] = 0;
  in_RCX[7] = 0;
  in_RCX[4] = 0;
  in_RCX[5] = 0;
  in_RCX[8] = 0;
  in_RCX[2] = 0;
  in_RCX[3] = 0;
  *in_RCX = 0;
  in_RCX[1] = 0;
  if (U_ZERO_ERROR < *in_R8) {
    return in_EAX;
  }
  initializeDecimalFormatSymbols(this,in_R8);
  initializeDefaultInfinityRule(this,in_R8);
  pNVar9 = initializeDefaultNaNRule(this,in_R8);
  if (U_ZERO_ERROR < *in_R8) {
    return (int)pNVar9;
  }
  if (in_RDX != (LocalizationInfo *)0x0) {
    in_RDX->refcount = in_RDX->refcount + 1;
  }
  this->localizations = in_RDX;
  this_00 = (RuleBasedNumberFormat *)&description;
  UnicodeString::UnicodeString((UnicodeString *)this_00,(UnicodeString *)ctx);
  uVar4 = description.fUnion.fFields.fLength;
  if (-1 < description.fUnion.fStackFields.fLengthAndFlags) {
    uVar4 = (int)description.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  local_dc = U_MEMORY_ALLOCATION_ERROR;
  if (uVar4 != 0) {
    stripWhitespace(this_00,&description);
    uVar5 = UnicodeString::indexOf(&description,L"%%lenient-parse:",-1,0);
    if ((uVar5 == 0xffffffff) ||
       ((uVar5 != 0 && (cVar3 = UnicodeString::doCharAt(&description,uVar5 - 1), cVar3 != L';')))) {
LAB_0021e5b3:
      this->numRuleSets = 0;
      size_00 = L";%";
      iVar8 = UnicodeString::indexOf(&description,L";%",2,0);
      while( true ) {
        iVar15 = this->numRuleSets;
        this->numRuleSets = iVar15 + 1;
        if (iVar8 == -1) break;
        size_00 = L";%";
        iVar8 = UnicodeString::indexOf(&description,L";%",2,iVar8 + 1);
      }
      ppNVar11 = (NFRuleSet **)uprv_malloc_63((long)iVar15 * 8 + 0x10);
      this->fRuleSets = ppNVar11;
      if (ppNVar11 != (NFRuleSet **)0x0) {
        iVar8 = this->numRuleSets;
        lVar18 = (long)iVar8;
        for (lVar12 = 0; lVar12 <= lVar18; lVar12 = lVar12 + 1) {
          this->fRuleSets[lVar12] = (NFRuleSet *)0x0;
        }
        if (iVar8 == 0) {
          local_dc = U_ILLEGAL_ARGUMENT_ERROR;
        }
        else {
          this_01 = (UMemory *)0xffffffffffffffff;
          if (-1 < iVar8) {
            this_01 = (UMemory *)(lVar18 * 0x40 + 8);
          }
          plVar13 = (long *)UMemory::operator_new__(this_01,(size_t)size_00);
          if (plVar13 == (long *)0x0) {
            lVar12 = 0x170;
            goto LAB_0021e76c;
          }
          *plVar13 = lVar18;
          lVar12 = 0;
          do {
            *(undefined ***)((long)plVar13 + lVar12 + 8) = &PTR__UnicodeString_003b0268;
            *(undefined2 *)((long)plVar13 + lVar12 + 0x10) = 2;
            lVar12 = lVar12 + 0x40;
          } while (lVar18 * 0x40 != lVar12);
          this->ruleSetDescriptions = (UnicodeString *)(plVar13 + 1);
          iVar6 = UnicodeString::indexOf(&description,L";%",2,0);
          lVar12 = 0;
          uVar17 = 0;
          iVar8 = 0;
          while (iVar6 != -1) {
            iVar15 = iVar6 + 1;
            pUVar10 = &description;
            UnicodeString::setTo
                      ((UnicodeString *)
                       ((long)&(this->ruleSetDescriptions->super_Replaceable).super_UObject.
                               _vptr_UObject + lVar12),pUVar10,iVar8,iVar15 - iVar8);
            pNVar14 = (NFRuleSet *)UMemory::operator_new((UMemory *)0xa8,(size_t)pUVar10);
            if (pNVar14 != (NFRuleSet *)0x0) {
              NFRuleSet::NFRuleSet(pNVar14,this,this->ruleSetDescriptions,(int32_t)uVar17,in_R8);
            }
            this->fRuleSets[uVar17] = pNVar14;
            if (this->fRuleSets[uVar17] == (NFRuleSet *)0x0) goto LAB_0021e771;
            iVar6 = UnicodeString::indexOf(&description,L";%",2,iVar15);
            uVar17 = uVar17 + 1;
            lVar12 = lVar12 + 0x40;
            iVar8 = iVar15;
          }
          uVar16 = uVar17 & 0xffffffff;
          if (-1 < description.fUnion.fStackFields.fLengthAndFlags) {
            description.fUnion.fFields.fLength =
                 (int)description.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          pUVar10 = &description;
          UnicodeString::setTo
                    (this->ruleSetDescriptions + uVar16,pUVar10,iVar8,
                     description.fUnion.fFields.fLength - iVar8);
          pNVar14 = (NFRuleSet *)UMemory::operator_new((UMemory *)0xa8,(size_t)pUVar10);
          if (pNVar14 != (NFRuleSet *)0x0) {
            NFRuleSet::NFRuleSet(pNVar14,this,this->ruleSetDescriptions,(int32_t)uVar17,in_R8);
          }
          this->fRuleSets[uVar16] = pNVar14;
          if (this->fRuleSets[uVar16] != (NFRuleSet *)0x0) {
            initDefaultRuleSet(this);
            lVar18 = 0;
            for (lVar12 = 0; lVar12 < this->numRuleSets; lVar12 = lVar12 + 1) {
              NFRuleSet::parseRules
                        (this->fRuleSets[lVar12],
                         (UnicodeString *)
                         ((long)&(this->ruleSetDescriptions->super_Replaceable).super_UObject.
                                 _vptr_UObject + lVar18),in_R8);
              lVar18 = lVar18 + 0x40;
            }
            if (in_RDX != (LocalizationInfo *)0x0) {
              for (uVar5 = 0; iVar8 = (*in_RDX->_vptr_LocalizationInfo[3])(), (int)uVar5 < iVar8;
                  uVar5 = uVar5 + 1) {
                iVar8 = (*in_RDX->_vptr_LocalizationInfo[4])(in_RDX,(ulong)uVar5);
                local_d0.p_ = (char16_t *)CONCAT44(extraout_var,iVar8);
                UnicodeString::UnicodeString(&name,'\x01',&local_d0,-1);
                pNVar14 = findRuleSet(this,&name,in_R8);
                if (pNVar14 == (NFRuleSet *)0x0) {
                  UnicodeString::~UnicodeString(&name);
                  break;
                }
                if (uVar5 == 0) {
                  this->defaultRuleSet = pNVar14;
                }
                UnicodeString::~UnicodeString(&name);
              }
            }
            UnicodeString::operator=(&this->originalDescription,(UnicodeString *)ctx);
            goto LAB_0021e777;
          }
        }
      }
    }
    else {
      iVar6 = UnicodeString::indexOf(&description,L";%",2,uVar5);
      if (iVar6 == -1) {
        uVar4 = description.fUnion.fFields.fLength;
        if (-1 < description.fUnion.fStackFields.fLengthAndFlags) {
          uVar4 = (int)description.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        iVar6 = uVar4 + -1;
      }
      iVar7 = u_strlen_63(L"%%lenient-parse:");
      offset = iVar7 + uVar5;
      while( true ) {
        size = (size_t)offset;
        cVar3 = UnicodeString::doCharAt(&description,offset);
        UVar2 = PatternProps::isWhiteSpace((uint)(ushort)cVar3);
        if (UVar2 == '\0') break;
        offset = offset + 1;
      }
      pUVar10 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,size);
      if (pUVar10 != (UnicodeString *)0x0) {
        (pUVar10->super_Replaceable).super_UObject._vptr_UObject =
             (_func_int **)&PTR__UnicodeString_003b0268;
        (pUVar10->fUnion).fStackFields.fLengthAndFlags = 2;
        this->lenientParseRules = pUVar10;
        UnicodeString::setTo(pUVar10,&description,offset,iVar6 - offset);
        UnicodeString::remove(&description,(char *)(ulong)uVar5);
        goto LAB_0021e5b3;
      }
      lVar12 = 0x290;
LAB_0021e76c:
      pcVar1 = (this->super_NumberFormat).super_Format.actualLocale + lVar12 + -8;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
    }
  }
LAB_0021e771:
  *in_R8 = local_dc;
LAB_0021e777:
  UnicodeString::~UnicodeString(&description);
  return extraout_EAX;
}

Assistant:

void
RuleBasedNumberFormat::init(const UnicodeString& rules, LocalizationInfo* localizationInfos,
                            UParseError& pErr, UErrorCode& status)
{
    // TODO: implement UParseError
    uprv_memset(&pErr, 0, sizeof(UParseError));
    // Note: this can leave ruleSets == NULL, so remaining code should check
    if (U_FAILURE(status)) {
        return;
    }

    initializeDecimalFormatSymbols(status);
    initializeDefaultInfinityRule(status);
    initializeDefaultNaNRule(status);
    if (U_FAILURE(status)) {
        return;
    }

    this->localizations = localizationInfos == NULL ? NULL : localizationInfos->ref();

    UnicodeString description(rules);
    if (!description.length()) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }

    // start by stripping the trailing whitespace from all the rules
    // (this is all the whitespace follwing each semicolon in the
    // description).  This allows us to look for rule-set boundaries
    // by searching for ";%" without having to worry about whitespace
    // between the ; and the %
    stripWhitespace(description);

    // check to see if there's a set of lenient-parse rules.  If there
    // is, pull them out into our temporary holding place for them,
    // and delete them from the description before the real desciption-
    // parsing code sees them
    int32_t lp = description.indexOf(gLenientParse, -1, 0);
    if (lp != -1) {
        // we've got to make sure we're not in the middle of a rule
        // (where "%%lenient-parse" would actually get treated as
        // rule text)
        if (lp == 0 || description.charAt(lp - 1) == gSemiColon) {
            // locate the beginning and end of the actual collation
            // rules (there may be whitespace between the name and
            // the first token in the description)
            int lpEnd = description.indexOf(gSemiPercent, 2, lp);

            if (lpEnd == -1) {
                lpEnd = description.length() - 1;
            }
            int lpStart = lp + u_strlen(gLenientParse);
            while (PatternProps::isWhiteSpace(description.charAt(lpStart))) {
                ++lpStart;
            }

            // copy out the lenient-parse rules and delete them
            // from the description
            lenientParseRules = new UnicodeString();
            /* test for NULL */
            if (lenientParseRules == nullptr) {
                status = U_MEMORY_ALLOCATION_ERROR;
                return;
            }
            lenientParseRules->setTo(description, lpStart, lpEnd - lpStart);

            description.remove(lp, lpEnd + 1 - lp);
        }
    }

    // pre-flight parsing the description and count the number of
    // rule sets (";%" marks the end of one rule set and the beginning
    // of the next)
    numRuleSets = 0;
    for (int32_t p = description.indexOf(gSemiPercent, 2, 0); p != -1; p = description.indexOf(gSemiPercent, 2, p)) {
        ++numRuleSets;
        ++p;
    }
    ++numRuleSets;

    // our rule list is an array of the appropriate size
    fRuleSets = (NFRuleSet **)uprv_malloc((numRuleSets + 1) * sizeof(NFRuleSet *));
    /* test for NULL */
    if (fRuleSets == 0) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }

    for (int i = 0; i <= numRuleSets; ++i) {
        fRuleSets[i] = NULL;
    }

    // divide up the descriptions into individual rule-set descriptions
    // and store them in a temporary array.  At each step, we also
    // new up a rule set, but all this does is initialize its name
    // and remove it from its description.  We can't actually parse
    // the rest of the descriptions and finish initializing everything
    // because we have to know the names and locations of all the rule
    // sets before we can actually set everything up
    if(!numRuleSets) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    ruleSetDescriptions = new UnicodeString[numRuleSets];
    if (ruleSetDescriptions == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }

    {
        int curRuleSet = 0;
        int32_t start = 0;
        for (int32_t p = description.indexOf(gSemiPercent, 2, 0); p != -1; p = description.indexOf(gSemiPercent, 2, start)) {
            ruleSetDescriptions[curRuleSet].setTo(description, start, p + 1 - start);
            fRuleSets[curRuleSet] = new NFRuleSet(this, ruleSetDescriptions, curRuleSet, status);
            if (fRuleSets[curRuleSet] == nullptr) {
                status = U_MEMORY_ALLOCATION_ERROR;
                return;
            }
            ++curRuleSet;
            start = p + 1;
        }
        ruleSetDescriptions[curRuleSet].setTo(description, start, description.length() - start);
        fRuleSets[curRuleSet] = new NFRuleSet(this, ruleSetDescriptions, curRuleSet, status);
        if (fRuleSets[curRuleSet] == nullptr) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return;
        }
    }

    // now we can take note of the formatter's default rule set, which
    // is the last public rule set in the description (it's the last
    // rather than the first so that a user can create a new formatter
    // from an existing formatter and change its default behavior just
    // by appending more rule sets to the end)

    // {dlf} Initialization of a fraction rule set requires the default rule
    // set to be known.  For purposes of initialization, this is always the 
    // last public rule set, no matter what the localization data says.
    initDefaultRuleSet();

    // finally, we can go back through the temporary descriptions
    // list and finish setting up the substructure (and we throw
    // away the temporary descriptions as we go)
    {
        for (int i = 0; i < numRuleSets; i++) {
            fRuleSets[i]->parseRules(ruleSetDescriptions[i], status);
        }
    }

    // Now that the rules are initialized, the 'real' default rule
    // set can be adjusted by the localization data.

    // The C code keeps the localization array as is, rather than building
    // a separate array of the public rule set names, so we have less work
    // to do here-- but we still need to check the names.
    
    if (localizationInfos) {
        // confirm the names, if any aren't in the rules, that's an error
        // it is ok if the rules contain public rule sets that are not in this list
        for (int32_t i = 0; i < localizationInfos->getNumberOfRuleSets(); ++i) {
            UnicodeString name(TRUE, localizationInfos->getRuleSetName(i), -1);
            NFRuleSet* rs = findRuleSet(name, status);
            if (rs == NULL) {
                break; // error
            }
            if (i == 0) {
                defaultRuleSet = rs;
            }
        }
    } else {
        defaultRuleSet = getDefaultRuleSet();
    }
    originalDescription = rules;
}